

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O2

int fffr4u4(float *input,long ntodo,double scale,double zero,int nullcheck,unsigned_long nullval,
           char *nullarray,int *anynull,unsigned_long *output,int *status)

{
  float fVar1;
  ushort uVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  if (nullcheck == 0) {
    lVar6 = 0;
    if (0 < ntodo) {
      lVar6 = ntodo;
    }
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
        dVar7 = (double)input[lVar4] * scale + zero;
        if (-0.49 <= dVar7) {
          if (dVar7 <= 1.844674407370955e+19) {
            uVar5 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
          }
          else {
            *status = -0xb;
            uVar5 = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          uVar5 = 0;
        }
        output[lVar4] = uVar5;
      }
    }
    else {
      for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
        fVar1 = input[lVar4];
        if (-0.49 <= fVar1) {
          if (fVar1 <= 1.8446744e+19) {
            uVar5 = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
          }
          else {
            *status = -0xb;
            uVar5 = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          uVar5 = 0;
        }
        output[lVar4] = uVar5;
      }
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    lVar6 = 0;
    if (ntodo < 1) {
      ntodo = lVar6;
    }
    for (; ntodo != lVar6; lVar6 = lVar6 + 1) {
      uVar2 = *(ushort *)((long)input + lVar6 * 4 + 2);
      cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar3 = '\x01';
      }
      if (cVar3 == '\0') {
        dVar7 = (double)input[lVar6] * scale + zero;
        if (dVar7 < -0.49) {
LAB_001a0c08:
          *status = -0xb;
          output[lVar6] = 0;
        }
        else if (1.844674407370955e+19 < dVar7) {
LAB_001a0c22:
          *status = -0xb;
          output[lVar6] = 0xffffffffffffffff;
        }
        else {
          output[lVar6] = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
        }
      }
      else if (cVar3 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar6] = nullval;
        }
        else {
          nullarray[lVar6] = '\x01';
        }
      }
      else {
        if (zero < -0.49) goto LAB_001a0c08;
        if (1.844674407370955e+19 < zero) goto LAB_001a0c22;
        output[lVar6] = (long)(zero - 9.223372036854776e+18) & (long)zero >> 0x3f | (long)zero;
      }
    }
  }
  else {
    lVar6 = 0;
    if (ntodo < 1) {
      ntodo = lVar6;
    }
    for (; ntodo != lVar6; lVar6 = lVar6 + 1) {
      uVar2 = *(ushort *)((long)input + lVar6 * 4 + 2);
      cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar3 = '\x01';
      }
      if (cVar3 == '\0') {
        fVar1 = input[lVar6];
        if (fVar1 < -0.49) {
          *status = -0xb;
          goto LAB_001a0a43;
        }
        if (fVar1 <= 1.8446744e+19) {
          output[lVar6] = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
        }
        else {
          *status = -0xb;
          output[lVar6] = 0xffffffffffffffff;
        }
      }
      else if (cVar3 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar6] = nullval;
        }
        else {
          nullarray[lVar6] = '\x01';
        }
      }
      else {
LAB_001a0a43:
        output[lVar6] = 0;
      }
    }
  }
  return *status;
}

Assistant:

int fffr4u4(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
   unsigned long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (zero > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                      output[ii] = (unsigned long) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) dvalue;
                }
            }
        }
    }
    return(*status);
}